

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::ExpressionStatement::evalImpl(ExpressionStatement *this,EvalContext *context)

{
  SourceRange range;
  bool bVar1;
  SubroutineKind SVar2;
  CallExpression *in_RDI;
  string_view sVar3;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  CallExpression *in_stack_ffffffffffffff78;
  Diagnostic *in_stack_ffffffffffffffb0;
  EvalContext *in_stack_ffffffffffffffb8;
  SourceLocation in_stack_ffffffffffffffc0;
  SourceLocation in_stack_ffffffffffffffc8;
  
  if (*(int *)(in_RDI->super_Expression).sourceRange.startLoc == 0x15) {
    Expression::as<slang::ast::CallExpression>
              ((Expression *)(in_RDI->super_Expression).sourceRange.startLoc);
    bVar1 = CallExpression::isSystemCall((CallExpression *)0xa754c7);
    if (bVar1) {
      Expression::as<slang::ast::CallExpression>
                ((Expression *)(in_RDI->super_Expression).sourceRange.startLoc);
      SVar2 = CallExpression::getSubroutineKind(in_stack_ffffffffffffff78);
      if (SVar2 == Task) {
        range.endLoc = in_stack_ffffffffffffffc8;
        range.startLoc = in_stack_ffffffffffffffc0;
        EvalContext::addDiag
                  (in_stack_ffffffffffffffb8,
                   SUB84((ulong)*(undefined8 *)
                                 ((long)(in_RDI->super_Expression).sourceRange.startLoc + 0x20) >>
                         0x20,0),range);
        Expression::as<slang::ast::CallExpression>
                  ((Expression *)(in_RDI->super_Expression).sourceRange.startLoc);
        sVar3 = CallExpression::getSubroutineName(in_RDI);
        sVar3._M_str = (char *)sVar3._M_len;
        sVar3._M_len = (size_t)in_stack_ffffffffffffffb8;
        Diagnostic::operator<<(in_stack_ffffffffffffffb0,sVar3);
        return Success;
      }
    }
  }
  Expression::eval(&in_stack_ffffffffffffff78->super_Expression,
                   (EvalContext *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa755a0);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xa755c8);
  return (uint)bVar1;
}

Assistant:

ER ExpressionStatement::evalImpl(EvalContext& context) const {
    // Skip system task invocations.
    if (expr.kind == ExpressionKind::Call && expr.as<CallExpression>().isSystemCall() &&
        expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task) {
        context.addDiag(diag::ConstSysTaskIgnored, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
        return ER::Success;
    }

    return expr.eval(context) ? ER::Success : ER::Fail;
}